

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixPic.cpp
# Opt level: O3

HighsStatus
writeRmatrixPicToFile
          (HighsOptions *options,string *fileprefix,HighsInt numRow,HighsInt numCol,
          vector<int,_std::allocator<int>_> *ARstart,vector<int,_std::allocator<int>_> *ARindex)

{
  pointer pcVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  HighsStatus HVar8;
  ostream *poVar9;
  long *plVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  char cVar15;
  long lVar16;
  long lVar17;
  HighsInt HVar18;
  uint uVar19;
  string filename;
  vector<int,_std::allocator<int>_> value;
  ofstream f;
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  vector<int,_std::allocator<int>_> local_268;
  vector<int,_std::allocator<int>_> *local_250;
  vector<int,_std::allocator<int>_> *local_248;
  size_t local_240;
  value_type_conflict2 local_234;
  undefined1 local_230 [248];
  ios_base local_138 [264];
  
  local_250 = ARstart;
  local_248 = ARindex;
  iVar6 = std::__cxx11::string::compare((char *)fileprefix);
  if (iVar6 == 0) {
    HVar8 = kError;
  }
  else {
    local_288[0] = local_278;
    pcVar1 = (fileprefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_288,pcVar1,pcVar1 + fileprefix->_M_string_length);
    std::__cxx11::string::append((char *)local_288);
    std::ofstream::ofstream(local_230);
    std::ofstream::open((string *)local_230,(_Ios_Openmode)local_288);
    uVar19 = 1;
    uVar7 = 1;
    if (0x63e < numCol) {
      uVar7 = (uint)numCol / 0x63e + (uint)(((uint)numCol / 0x63e) * 0x63e < (uint)numCol);
    }
    if (0x382 < numRow) {
      uVar19 = (uint)numRow / 0x382 + (uint)(((uint)numRow / 0x382) * 0x382 < (uint)numRow);
    }
    if (uVar19 < uVar7) {
      uVar19 = uVar7;
    }
    iVar6 = numCol / (int)uVar19;
    bVar4 = (int)(uVar19 * iVar6) < numCol;
    uVar12 = iVar6 + (uint)bVar4 + 2;
    uVar7 = numRow / (int)uVar19 + (uint)((int)((numRow / (int)uVar19) * uVar19) < numRow) + 2;
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kInfo,
                 "Representing LP constraint matrix sparsity pattern %dx%d .pbm file, mapping entries in square of size %d onto one pixel\n"
                 ,(ulong)uVar12,(ulong)uVar7,(ulong)uVar19);
    local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_234 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_268,(long)(int)uVar12,&local_234);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"P1",2);
    std::ios::widen((char)(ostream *)local_230 + (char)*(_func_int **)(local_230._0_8_ + -0x18));
    std::ostream::put((char)local_230);
    std::ostream::flush();
    poVar9 = (ostream *)std::ostream::operator<<(local_230,uVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    plVar10 = (long *)std::ostream::operator<<(poVar9,uVar7);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    uVar7 = iVar6 + (uint)bVar4;
    if (-2 < (int)uVar7) {
      uVar13 = uVar12;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"1 ",2);
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    std::ios::widen((char)local_230 + (char)*(_func_int **)(local_230._0_8_ + -0x18));
    cVar15 = (char)(ostream *)local_230;
    std::ostream::put(cVar15);
    std::ostream::flush();
    local_240 = (ulong)(uVar7 - 1) * 4 + 4;
    iVar6 = 0;
    do {
      iVar11 = iVar6 + uVar19;
      HVar18 = numRow;
      if (iVar11 < numRow) {
        HVar18 = iVar11;
      }
      if (iVar6 < HVar18) {
        piVar2 = (local_250->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (local_248->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar16 = (long)iVar6;
        iVar6 = piVar2[lVar16];
        do {
          lVar17 = lVar16 + 1;
          lVar16 = lVar16 + 1;
          iVar5 = piVar2[lVar17];
          if (iVar6 < piVar2[lVar17]) {
            lVar17 = (long)iVar6;
            do {
              local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[piVar3[lVar17] / (int)uVar19] = 1;
              lVar17 = lVar17 + 1;
              iVar5 = piVar2[lVar16];
            } while (lVar17 < piVar2[lVar16]);
          }
          iVar6 = iVar5;
        } while (lVar16 != HVar18);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"1 ",2);
      if (0 < (int)uVar7) {
        uVar14 = 0;
        do {
          poVar9 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)local_230,
                              local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar14]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          uVar14 = uVar14 + 1;
        } while (uVar7 != uVar14);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"1 ",2);
      std::ios::widen((char)*(_func_int **)(local_230._0_8_ + -0x18) + cVar15);
      std::ostream::put(cVar15);
      std::ostream::flush();
      if (0 < (int)uVar7) {
        memset(local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,0,local_240);
      }
      iVar6 = HVar18;
    } while (iVar11 < numRow);
    if (-2 < (int)uVar7) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"1 ",2);
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    std::ios::widen(cVar15 + (char)*(_func_int **)(local_230._0_8_ + -0x18));
    std::ostream::put((char)local_230);
    std::ostream::flush();
    if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + (long)_VTT[-3]) = _strtod;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    if (local_288[0] != local_278) {
      operator_delete(local_288[0]);
    }
    HVar8 = kOk;
  }
  return HVar8;
}

Assistant:

HighsStatus writeRmatrixPicToFile(const HighsOptions& options,
                                  const std::string fileprefix,
                                  const HighsInt numRow, const HighsInt numCol,
                                  const std::vector<HighsInt>& ARstart,
                                  const std::vector<HighsInt>& ARindex) {
  if (fileprefix == "") return HighsStatus::kError;
  std::string filename = fileprefix + ".pbm";
  std::ofstream f;
  f.open(filename, std::ios::out);
  const HighsInt border_width = 1;
  const HighsInt max_num_pixel_wide = 1600;
  const HighsInt max_num_pixel_deep = 900;
  const HighsInt max_num_matrix_pixel_wide =
      max_num_pixel_wide - 2 * border_width;
  const HighsInt max_num_matrix_pixel_deep =
      max_num_pixel_deep - 2 * border_width;
  HighsInt num_col_per_pixel = 1;
  HighsInt num_row_per_pixel = 1;
  if (numCol > max_num_matrix_pixel_wide) {
    num_col_per_pixel = numCol / max_num_matrix_pixel_wide;
    if (num_col_per_pixel * max_num_matrix_pixel_wide < numCol)
      num_col_per_pixel++;
  }
  if (numRow > max_num_matrix_pixel_deep) {
    num_row_per_pixel = numRow / max_num_matrix_pixel_deep;
    if (num_row_per_pixel * max_num_matrix_pixel_deep < numRow)
      num_row_per_pixel++;
  }
  const HighsInt dim_per_pixel = std::max(num_col_per_pixel, num_row_per_pixel);
  HighsInt num_pixel_wide = numCol / dim_per_pixel;
  if (dim_per_pixel * num_pixel_wide < numCol) num_pixel_wide++;
  HighsInt num_pixel_deep = numRow / dim_per_pixel;
  if (dim_per_pixel * num_pixel_deep < numRow) num_pixel_deep++;
  // Account for the borders
  num_pixel_wide += 2;
  num_pixel_deep += 2;
  assert(num_pixel_wide <= max_num_pixel_wide);
  assert(num_pixel_deep <= max_num_pixel_deep);

  highsLogUser(
      options.log_options, HighsLogType::kInfo,
      "Representing LP constraint matrix sparsity pattern %" HIGHSINT_FORMAT
      "x%" HIGHSINT_FORMAT
      " .pbm file,"
      " mapping entries in square of size %" HIGHSINT_FORMAT
      " onto one pixel\n",
      num_pixel_wide, num_pixel_deep, dim_per_pixel);

  std::vector<HighsInt> value;
  value.assign(num_pixel_wide, 0);
  f << "P1" << std::endl;
  f << num_pixel_wide << " " << num_pixel_deep << std::endl;
  HighsInt pic_num_row = 0;
  // Top border
  for (HighsInt pixel = 0; pixel < num_pixel_wide; pixel++) f << "1 ";
  f << std::endl;
  pic_num_row++;
  HighsInt from_row = 0;
  for (;;) {
    HighsInt to_row = std::min(from_row + dim_per_pixel, numRow);
    for (HighsInt iRow = from_row; iRow < to_row; iRow++) {
      for (HighsInt iEl = ARstart[iRow]; iEl < ARstart[iRow + 1]; iEl++) {
        HighsInt iCol = ARindex[iEl];
        HighsInt pixel = iCol / dim_per_pixel;
        assert(pixel < num_pixel_wide - 2);
        value[pixel] = 1;
      }
    }
    // LH border
    f << "1 ";
    for (HighsInt pixel = 0; pixel < num_pixel_wide - 2; pixel++)
      f << value[pixel] << " ";
    // LH border
    f << "1 " << std::endl;
    pic_num_row++;
    for (HighsInt pixel = 0; pixel < num_pixel_wide - 2; pixel++)
      value[pixel] = 0;
    if (to_row == numRow) break;
    from_row = to_row;
  }

  // Bottom border
  for (HighsInt pixel = 0; pixel < num_pixel_wide; pixel++) f << "1 ";
  f << std::endl;
  pic_num_row++;
  assert(pic_num_row == num_pixel_deep);

  return HighsStatus::kOk;
}